

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredMMDPDiscrete.cpp
# Opt level: O0

void __thiscall FactoredMMDPDiscrete::Initialize2DBN(FactoredMMDPDiscrete *this)

{
  MultiAgentDecisionProcessDiscreteFactoredStates *in_RDI;
  EmptyObservationProbFunctor of;
  BoundTransitionProbFunctor<FactoredMMDPDiscrete> tf;
  BoundScopeFunctor<FactoredMMDPDiscrete> sf;
  ObservationProbFunctor *in_stack_00000338;
  TransitionProbFunctor *in_stack_00000340;
  ScopeFunctor *in_stack_00000348;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_stack_00000350;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  FactoredMMDPDiscrete *in_stack_ffffffffffffff88;
  BoundScopeFunctor<FactoredMMDPDiscrete> *in_stack_ffffffffffffff90;
  FactoredMMDPDiscrete *in_stack_ffffffffffffffb0;
  
  ConstructObservations(in_stack_ffffffffffffffb0);
  MultiAgentDecisionProcessDiscreteFactoredStates::SetObservationsInitialized
            (in_RDI,(bool)in_stack_ffffffffffffff7f);
  MultiAgentDecisionProcessDiscreteFactoredStates::BoundScopeFunctor<FactoredMMDPDiscrete>::
  BoundScopeFunctor(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                    CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  MultiAgentDecisionProcessDiscreteFactoredStates::BoundTransitionProbFunctor<FactoredMMDPDiscrete>
  ::BoundTransitionProbFunctor
            ((BoundTransitionProbFunctor<FactoredMMDPDiscrete> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)
            );
  MultiAgentDecisionProcessDiscreteFactoredStates::EmptyObservationProbFunctor::
  EmptyObservationProbFunctor((EmptyObservationProbFunctor *)in_RDI);
  MultiAgentDecisionProcessDiscreteFactoredStates::Initialize2DBN
            (in_stack_00000350,in_stack_00000348,in_stack_00000340,in_stack_00000338);
  Initialize2DBNObservations(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void FactoredMMDPDiscrete::Initialize2DBN()
{
    // construct observations
    ConstructObservations();
    SetObservationsInitialized(true); // Note: joint indices are likely to break

    BoundScopeFunctor<FactoredMMDPDiscrete> sf(this,&FactoredMMDPDiscrete::SetScopes);
    BoundTransitionProbFunctor<FactoredMMDPDiscrete> tf(this,&FactoredMMDPDiscrete::ComputeTransitionProb);
    EmptyObservationProbFunctor of;
    
    MultiAgentDecisionProcessDiscreteFactoredStates::Initialize2DBN(sf, tf, of); 

    // above calls SetOScopes and initializes CPD vector for observation variables
    Initialize2DBNObservations(); // set actual CPDs
}